

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O2

void __thiscall HdlcAnalyzer::ProcessControlField(HdlcAnalyzer *this)

{
  U64 UVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  Frame frame_1;
  byte local_b8;
  HdlcByte byte;
  HdlcByte byte0;
  Frame frame;
  
  if (this->mAbortFrame == false) {
    if (((this->mSettings)._M_ptr)->mHdlcControl == HDLC_BASIC_CONTROL_FIELD) {
      ReadByte((HdlcByte *)&frame_1,this);
      _frame = _frame_1;
      if (this->mAbortFrame != false) {
        return;
      }
      Frame::Frame(&frame);
      std::vector<Frame,_std::allocator<Frame>_>::push_back(&this->mResultFrames,&frame);
      this->mCurrentFrameIsSFrame = (local_b8 & 3) == 1;
    }
    else {
      ReadByte(&byte0,this);
      if (this->mAbortFrame != false) {
        return;
      }
      Frame::Frame(&frame);
      _frame = byte0.startSample;
      std::vector<Frame,_std::allocator<Frame>_>::push_back(&this->mResultFrames,&frame);
      bVar4 = (byte0.value & 2) + 1 & -(byte0.value & 1);
      this->mCurrentFrameIsSFrame = bVar4 == 1;
      if (bVar4 != 3) {
        uVar2 = ((this->mSettings)._M_ptr)->mHdlcControl - HDLC_EXTENDED_CONTROL_FIELD_MOD_128;
        if (uVar2 < 3) {
          uVar5 = *(ulong *)(&DAT_00110100 + (ulong)uVar2 * 8);
        }
        else {
          uVar5 = 0;
        }
        uVar3 = 1;
        while ((uVar3 < uVar5 &&
               (ReadByte(&byte,this), UVar1 = byte.startSample, this->mAbortFrame == false))) {
          Frame::Frame(&frame_1);
          _frame_1 = UVar1;
          std::vector<Frame,_std::allocator<Frame>_>::push_back(&this->mResultFrames,&frame_1);
          Frame::~Frame(&frame_1);
          uVar3 = uVar3 + 1;
        }
      }
    }
    Frame::~Frame(&frame);
  }
  return;
}

Assistant:

void HdlcAnalyzer::ProcessControlField()
{
    if( mAbortFrame )
    {
        return;
    }

    if( mSettings->mHdlcControl == HDLC_BASIC_CONTROL_FIELD ) // Basic Control Field of 1 byte
    {
        HdlcByte controlByte = ReadByte();
        if( mAbortFrame )
        {
            return;
        }

        U8 flag = ( controlByte.escaped ) ? HDLC_ESCAPED_BYTE : 0;
        Frame frame = CreateFrame( HDLC_FIELD_BASIC_CONTROL, controlByte.startSample, controlByte.endSample, controlByte.value, 0, flag );
        AddFrameToResults( frame );

        HdlcFrameType frameType = GetFrameType( controlByte.value );
        mCurrentFrameIsSFrame = ( frameType == HDLC_S_FRAME );
    }
    else // Extended Control Field
    {
        // Read first byte and check type of frame
        HdlcByte byte0 = ReadByte();
        if( mAbortFrame )
        {
            return;
        }
        HdlcFrameType frameType = GetFrameType( byte0.value );
        U8 flag = ( byte0.escaped ) ? HDLC_ESCAPED_BYTE : 0;

        Frame frame0 = CreateFrame( HDLC_FIELD_EXTENDED_CONTROL, byte0.startSample, byte0.endSample, byte0.value, 0, flag );
        AddFrameToResults( frame0 );

        mCurrentFrameIsSFrame = ( frameType == HDLC_S_FRAME );

        if( frameType != HDLC_U_FRAME )
        {
            U32 ctlBytes = 0;
            switch( mSettings->mHdlcControl )
            {
            case HDLC_EXTENDED_CONTROL_FIELD_MOD_128:
                ctlBytes = 2;
                break;
            case HDLC_EXTENDED_CONTROL_FIELD_MOD_32768:
                ctlBytes = 4;
                break;
            case HDLC_EXTENDED_CONTROL_FIELD_MOD_2147483648:
                ctlBytes = 8;
                break;
            }
            for( U32 i = 1; i < ctlBytes; ++i )
            {
                HdlcByte byte = ReadByte();
                if( mAbortFrame )
                {
                    return;
                }
                U8 flag = ( byte.escaped ) ? HDLC_ESCAPED_BYTE : 0;
                Frame frame = CreateFrame( HDLC_FIELD_EXTENDED_CONTROL, byte.startSample, byte.endSample, byte.value, i, flag );
                AddFrameToResults( frame );
            }
        }
    }
}